

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O0

int Cnf_CutMergeLeaves(Cnf_Cut_t *pCut,Cnf_Cut_t *pCutFan,int *pFanins)

{
  bool bVar1;
  int local_2c;
  int local_28;
  int nFanins;
  int k;
  int i;
  int *pFanins_local;
  Cnf_Cut_t *pCutFan_local;
  Cnf_Cut_t *pCut_local;
  
  local_2c = 0;
  local_28 = 0;
  nFanins = 0;
  while( true ) {
    bVar1 = false;
    if (nFanins < pCut->nFanins) {
      bVar1 = local_28 < pCutFan->nFanins;
    }
    if (!bVar1) break;
    if (*(int *)((long)pCut[1].vIsop + (long)nFanins * 4 + -8) ==
        *(int *)((long)pCutFan[1].vIsop + (long)local_28 * 4 + -8)) {
      pFanins[local_2c] = *(int *)((long)pCut[1].vIsop + (long)nFanins * 4 + -8);
      nFanins = nFanins + 1;
      local_28 = local_28 + 1;
    }
    else if (*(int *)((long)pCut[1].vIsop + (long)nFanins * 4 + -8) <
             *(int *)((long)pCutFan[1].vIsop + (long)local_28 * 4 + -8)) {
      pFanins[local_2c] = *(int *)((long)pCut[1].vIsop + (long)nFanins * 4 + -8);
      nFanins = nFanins + 1;
    }
    else {
      pFanins[local_2c] = *(int *)((long)pCutFan[1].vIsop + (long)local_28 * 4 + -8);
      local_28 = local_28 + 1;
    }
    local_2c = local_2c + 1;
  }
  for (; nFanins < pCut->nFanins; nFanins = nFanins + 1) {
    pFanins[local_2c] = *(int *)((long)pCut[1].vIsop + (long)nFanins * 4 + -8);
    local_2c = local_2c + 1;
  }
  for (; local_28 < pCutFan->nFanins; local_28 = local_28 + 1) {
    pFanins[local_2c] = *(int *)((long)pCutFan[1].vIsop + (long)local_28 * 4 + -8);
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

static inline int Cnf_CutMergeLeaves( Cnf_Cut_t * pCut, Cnf_Cut_t * pCutFan, int * pFanins )
{
    int i, k, nFanins = 0;
    for ( i = k = 0; i < pCut->nFanins && k < pCutFan->nFanins; )
    {
        if ( pCut->pFanins[i] == pCutFan->pFanins[k] )
            pFanins[nFanins++] = pCut->pFanins[i], i++, k++;
        else if ( pCut->pFanins[i] < pCutFan->pFanins[k] )
            pFanins[nFanins++] = pCut->pFanins[i], i++;
        else
            pFanins[nFanins++] = pCutFan->pFanins[k], k++;
    }
    for ( ; i < pCut->nFanins; i++ )
        pFanins[nFanins++] = pCut->pFanins[i];
    for ( ; k < pCutFan->nFanins; k++ )
        pFanins[nFanins++] = pCutFan->pFanins[k];
    return nFanins;
}